

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmcreg.cpp
# Opt level: O1

void vm_register_metaclasses(void)

{
  vm_meta_reg_t vVar1;
  long lVar2;
  
  if (G_meta_reg_table[0].meta != (CVmMetaclass **)0x0) {
    lVar2 = 0;
    vVar1.meta = G_meta_reg_table[0].meta;
    do {
      (*vVar1.meta)->meta_reg_idx_ = (uint)lVar2;
      vVar1.meta = G_meta_reg_table[lVar2 + 1].meta;
      lVar2 = lVar2 + 1;
    } while (vVar1.meta != (CVmMetaclass **)0x0);
  }
  return;
}

Assistant:

void vm_register_metaclasses()
{
    uint i;
    vm_meta_reg_t *entry;
    
    /* 
     *   run through the metaclass table and tell each metaclass its
     *   registration table index 
     */
    for (i = 0, entry = G_meta_reg_table ; entry->meta != 0 ;
         ++i, ++entry)
    {
        /* 
         *   Call this entry's class method to set its registration index.
         *   This is static information that never changes throughout the
         *   program's execution - we simply establish the registration
         *   table index for each metaclass once upon initialization.  
         */
        (*entry->meta)->set_metaclass_reg_index(i);
    }
}